

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O2

void slang::hash_combine<unsigned_long,unsigned_int>(size_t *seed,unsigned_long *v,uint rest)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint local_4;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *v;
  uVar1 = *seed;
  *seed = (uVar1 >> 2) + uVar1 * 0x40 + 0x9e3779b9 +
          (SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar2,8) ^
          SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar2,0)) ^ uVar1;
  hash_combine<unsigned_int>(seed,&local_4);
  return;
}

Assistant:

inline void hash_combine(size_t& seed, const T& v, Rest... rest) {
    hash<T> hasher;
    seed ^= hasher(v) + 0x9e3779b9 + (seed << 6) + (seed >> 2);
    hash_combine(seed, rest...);
}